

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::registerInterface(CommonCore *this,ActionMessage *command)

{
  shared_mutex *__rwlock;
  _Rb_tree_header *p_Var1;
  int32_t index;
  action_t aVar2;
  GlobalBrokerId GVar3;
  InterfaceHandle IVar4;
  BaseTimeCoordinator *pBVar5;
  byte *pbVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  string_view endpointType;
  string_view type_in;
  string_view units;
  string_view type_out;
  int iVar10;
  BasicHandleInfo *otherHandle;
  FederateState *this_00;
  uint *puVar11;
  string *psVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  TranslatorFederate *this_01;
  FilterFederate *this_02;
  string_view key;
  string_view key_00;
  ActionMessage add;
  ActionMessage local_e8;
  
  if ((command->dest_id).gid != 0) {
    routeMessage(this,command);
    return;
  }
  index = (command->source_handle).hid;
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  otherHandle = HandleManager::getHandleInfo(&(this->handles).m_obj,index);
  if (otherHandle != (BasicHandleInfo *)0x0) {
    HandleManager::addHandleAtIndex(&this->loopHandles,otherHandle,index);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  aVar2 = command->messageAction;
  if (aVar2 < cmd_reg_translator) {
    if (aVar2 != cmd_reg_pub) {
      if (aVar2 == cmd_reg_filter) {
        this_02 = this->filterFed;
        if (this_02 == (FilterFederate *)0x0) {
          generateFilterFederate(this);
          this_02 = this->filterFed;
        }
        GVar3.gid = (this->filterFedID)._M_i.gid;
        IVar4.hid = (command->source_handle).hid;
        pbVar6 = (command->payload).heap;
        sVar7 = (command->payload).bufferSize;
        psVar12 = ActionMessage::getString_abi_cxx11_(command,0);
        pcVar8 = (psVar12->_M_dataplus)._M_p;
        sVar9 = psVar12->_M_string_length;
        psVar12 = ActionMessage::getString_abi_cxx11_(command,1);
        type_in._M_str = pcVar8;
        type_in._M_len = sVar9;
        type_out._M_str = (psVar12->_M_dataplus)._M_p;
        type_out._M_len = psVar12->_M_string_length;
        key_00._M_str = (char *)pbVar6;
        key_00._M_len = sVar7;
        FilterFederate::createFilter
                  (this_02,GVar3,IVar4,key_00,type_in,type_out,
                   (bool)((byte)(command->flags >> 9) & 1));
        connectFilterTiming(this);
      }
      else if (aVar2 != cmd_reg_input) {
        return;
      }
    }
  }
  else if (aVar2 == cmd_reg_translator) {
    this_01 = this->translatorFed;
    if (this_01 == (TranslatorFederate *)0x0) {
      generateTranslatorFederate(this);
      this_01 = this->translatorFed;
    }
    GVar3.gid = (this->translatorFedID)._M_i.gid;
    IVar4.hid = (command->source_handle).hid;
    pbVar6 = (command->payload).heap;
    sVar7 = (command->payload).bufferSize;
    psVar12 = ActionMessage::getString_abi_cxx11_(command,0);
    pcVar8 = (psVar12->_M_dataplus)._M_p;
    sVar9 = psVar12->_M_string_length;
    psVar12 = ActionMessage::getString_abi_cxx11_(command,1);
    endpointType._M_str = pcVar8;
    endpointType._M_len = sVar9;
    units._M_str = (psVar12->_M_dataplus)._M_p;
    units._M_len = psVar12->_M_string_length;
    key._M_str = (char *)pbVar6;
    key._M_len = sVar7;
    TranslatorFederate::createTranslator(this_01,GVar3,IVar4,key,endpointType,units);
  }
  else if (aVar2 != cmd_reg_datasink) {
    if (aVar2 != cmd_reg_end) {
      return;
    }
    if (((this->super_BrokerBase).globalTime == false) && ((command->flags & 0x400) == 0)) {
      pBVar5 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      iVar10 = (*pBVar5->_vptr_BaseTimeCoordinator[4])(pBVar5,(ulong)(uint)(command->source_id).gid)
      ;
      if (((char)iVar10 != '\0') &&
         (this_00 = getFederateCore(this,(GlobalFederateId)(command->source_id).gid),
         this_00 != (FederateState *)0x0)) {
        ActionMessage::ActionMessage
                  (&local_e8,cmd_add_interdependency,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(command->source_id).gid);
        local_e8.flags._1_1_ = local_e8.flags._1_1_ | 0x20;
        FederateState::addAction(this_00,&local_e8);
        pBVar5 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar5->_vptr_BaseTimeCoordinator[5])(pBVar5,(ulong)(uint)(this_00->global_id)._M_i.gid);
        BaseTimeCoordinator::setAsChild
                  ((this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
                   (GlobalFederateId)(this_00->global_id)._M_i.gid);
        ActionMessage::~ActionMessage(&local_e8);
      }
      if (((this->super_BrokerBase).hasTimeDependency == false) &&
         (pBVar5 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
         iVar10 = (*pBVar5->_vptr_BaseTimeCoordinator[4])
                            (pBVar5,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid),
         (char)iVar10 != '\0')) {
        (this->super_BrokerBase).hasTimeDependency = true;
        ActionMessage::ActionMessage
                  (&local_e8,cmd_add_interdependency,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
        local_e8.flags._1_1_ = local_e8.flags._1_1_ | 0x40;
        p_Var14 = (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        puVar11 = &parent_route_id;
        if (p_Var14 != (_Base_ptr)0x0) {
          iVar10 = (this->super_BrokerBase).higher_broker_id.gid;
          p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = &p_Var1->_M_header;
          do {
            if (iVar10 <= (int)p_Var14[1]._M_color) {
              p_Var13 = p_Var14;
            }
            p_Var14 = (&p_Var14->_M_left)[(int)p_Var14[1]._M_color < iVar10];
          } while (p_Var14 != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var13 != p_Var1) {
            puVar11 = &parent_route_id;
            if ((int)p_Var13[1]._M_color <= iVar10) {
              puVar11 = (uint *)&p_Var13[1].field_0x4;
            }
          }
        }
        (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)*puVar11,&local_e8);
        pBVar5 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar5->_vptr_BaseTimeCoordinator[5])
                  (pBVar5,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
        BaseTimeCoordinator::setAsParent
                  ((this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
                   (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
        ActionMessage::~ActionMessage(&local_e8);
      }
    }
  }
  if ((command->payload).bufferSize != 0) {
    (*(this->super_Core)._vptr_Core[0x6c])(this,0,command);
  }
  return;
}

Assistant:

void CommonCore::registerInterface(ActionMessage& command)
{
    if (command.dest_id == parent_broker_id) {
        auto handle = command.source_handle;
        auto& loopHandleRef = loopHandles;
        handles.read([handle, &loopHandleRef](auto& hand) {
            auto ifc = hand.getHandleInfo(handle.baseValue());
            if (ifc != nullptr) {
                loopHandleRef.addHandleAtIndex(*ifc, handle.baseValue());
            }
        });

        switch (command.action()) {
            case CMD_REG_INPUT:
            case CMD_REG_PUB:
            case CMD_REG_DATASINK:
                break;
            case CMD_REG_ENDPOINT:
                if (globalTime) {
                    break;
                }
                if (checkActionFlag(command, targeted_flag)) {
                    break;
                }
                if (timeCoord->addDependency(command.source_id)) {
                    auto* fed = getFederateCore(command.source_id);
                    if (fed != nullptr) {
                        ActionMessage add(CMD_ADD_INTERDEPENDENCY,
                                          global_broker_id_local,
                                          command.source_id);

                        setActionFlag(add, parent_flag);
                        fed->addAction(add);
                        timeCoord->addDependent(fed->global_id);
                        timeCoord->setAsChild(fed->global_id);
                    }
                }

                if (!hasTimeDependency) {
                    if (timeCoord->addDependency(higher_broker_id)) {
                        hasTimeDependency = true;
                        ActionMessage add(CMD_ADD_INTERDEPENDENCY,
                                          global_broker_id_local,
                                          higher_broker_id);
                        setActionFlag(add, child_flag);

                        transmit(getRoute(higher_broker_id), add);

                        timeCoord->addDependent(higher_broker_id);
                        timeCoord->setAsParent(higher_broker_id);
                    }
                }
                break;
            case CMD_REG_FILTER:

                if (filterFed == nullptr) {
                    generateFilterFederate();
                }
                filterFed->createFilter(filterFedID.load(),
                                        command.source_handle,
                                        command.name(),
                                        command.getString(typeStringLoc),
                                        command.getString(typeOutStringLoc),
                                        checkActionFlag(command, clone_flag));
                connectFilterTiming();
                break;
            case CMD_REG_TRANSLATOR:

                if (translatorFed == nullptr) {
                    generateTranslatorFederate();
                }
                translatorFed->createTranslator(translatorFedID.load(),
                                                command.source_handle,
                                                command.name(),
                                                command.getString(typeStringLoc),
                                                command.getString(unitStringLoc));
                // connectFilterTiming();
                break;
            default:
                return;
        }
        if (!command.payload.empty()) {
            transmit(parent_route_id, std::move(command));
        }
    } else {
        routeMessage(std::move(command));
    }
}